

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::FramebufferGLImpl::FramebufferGLImpl
          (FramebufferGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
          FramebufferDesc *Desc,GLContextState *CtxState)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  TextureViewGLImpl *pTVar5;
  Uint32 NumRenderTargets;
  ulong uVar6;
  long lVar7;
  Uint32 rt;
  ulong uVar8;
  GLFrameBufferObj ResolveFBO;
  TextureViewGLImpl *ppRsvlViews [8];
  TextureViewGLImpl *ppRTVs [8];
  GLFrameBufferObj RenderTargetFBO;
  GLFrameBufferObj local_f0;
  GLFrameBufferObj local_dc;
  TextureViewGLImpl *local_c8 [16];
  GLFrameBufferObj local_44;
  long lVar3;
  
  FramebufferBase<Diligent::EngineGLImplTraits>::FramebufferBase
            (&this->super_FramebufferBase<Diligent::EngineGLImplTraits>,pRefCounters,pDevice,Desc,
             false);
  (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
  .super_ObjectBase<Diligent::IFramebuffer>.super_RefCountedObject<Diligent::IFramebuffer>.
  super_IFramebuffer.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_00a5a198;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SubpassFramebuffers).
  super__Vector_base<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = (*(((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
              .m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  std::
  vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,_std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>_>
  ::reserve(&this->m_SubpassFramebuffers,(ulong)*(uint *)(lVar3 + 0x18));
  for (uVar6 = 0; uVar6 < *(uint *)(lVar3 + 0x18); uVar6 = uVar6 + 1) {
    lVar7 = uVar6 * 0x48 + *(long *)(lVar3 + 0x20);
    local_c8[0xe] = (TextureViewGLImpl *)0x0;
    local_c8[0xf] = (TextureViewGLImpl *)0x0;
    local_c8[0xc] = (TextureViewGLImpl *)0x0;
    local_c8[0xd] = (TextureViewGLImpl *)0x0;
    local_c8[10] = (TextureViewGLImpl *)0x0;
    local_c8[0xb] = (TextureViewGLImpl *)0x0;
    local_c8[8] = (TextureViewGLImpl *)0x0;
    local_c8[9] = (TextureViewGLImpl *)0x0;
    for (uVar8 = 0; NumRenderTargets = *(uint *)(lVar7 + 0x10), uVar8 < NumRenderTargets;
        uVar8 = uVar8 + 1) {
      uVar4 = (ulong)*(uint *)(*(long *)(lVar7 + 0x18) + uVar8 * 8);
      if (uVar4 != 0xffffffff) {
        pTVar5 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                           ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                            super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                            .m_Desc.ppAttachments[uVar4]);
        local_c8[uVar8 + 8] = pTVar5;
      }
    }
    if ((*(uint **)(lVar7 + 0x28) == (uint *)0x0) ||
       (uVar8 = (ulong)**(uint **)(lVar7 + 0x28), uVar8 == 0xffffffff)) {
      pTVar5 = (TextureViewGLImpl *)0x0;
    }
    else {
      pTVar5 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                         ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                          super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                          .m_Desc.ppAttachments[uVar8]);
      NumRenderTargets = *(Uint32 *)(lVar7 + 0x10);
    }
    bVar1 = UseDefaultFBO(NumRenderTargets,local_c8 + 8,pTVar5);
    if (bVar1) {
      GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
                (&local_44,false,(GLFBOCreateReleaseHelper)0x0);
    }
    else {
      FBOCache::CreateFBO(&local_44,CtxState,*(Uint32 *)(lVar7 + 0x10),local_c8 + 8,pTVar5,
                          Desc->Width,Desc->Height);
    }
    GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
              (&local_f0,false,(GLFBOCreateReleaseHelper)0x0);
    if (*(long *)(lVar7 + 0x20) != 0) {
      local_c8[6] = (TextureViewGLImpl *)0x0;
      local_c8[7] = (TextureViewGLImpl *)0x0;
      local_c8[4] = (TextureViewGLImpl *)0x0;
      local_c8[5] = (TextureViewGLImpl *)0x0;
      local_c8[2] = (TextureViewGLImpl *)0x0;
      local_c8[3] = (TextureViewGLImpl *)0x0;
      local_c8[0] = (TextureViewGLImpl *)0x0;
      local_c8[1] = (TextureViewGLImpl *)0x0;
      for (uVar8 = 0; uVar8 < *(uint *)(lVar7 + 0x10); uVar8 = uVar8 + 1) {
        uVar4 = (ulong)*(uint *)(*(long *)(lVar7 + 0x20) + uVar8 * 8);
        if (uVar4 != 0xffffffff) {
          pTVar5 = ClassPtrCast<Diligent::TextureViewGLImpl,Diligent::ITextureView>
                             ((this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
                              super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                              .m_Desc.ppAttachments[uVar4]);
          local_c8[uVar8] = pTVar5;
        }
      }
      bVar1 = UseDefaultFBO(*(uint *)(lVar7 + 0x10),local_c8,(TextureViewGLImpl *)0x0);
      if (bVar1) {
        GLObjectWrappers::GLFrameBufferObj::GLFrameBufferObj
                  (&local_dc,false,(GLFBOCreateReleaseHelper)0x0);
      }
      else {
        FBOCache::CreateFBO(&local_dc,CtxState,*(Uint32 *)(lVar7 + 0x10),local_c8,
                            (TextureViewGLImpl *)0x0,Desc->Width,Desc->Height);
      }
      GLObjectWrappers::GLFrameBufferObj::operator=(&local_f0,&local_dc);
      GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
                (&local_dc.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::SetName
              (&local_44.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>,
               (this->super_FramebufferBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    std::
    vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
    ::emplace_back<GLObjectWrappers::GLFrameBufferObj,GLObjectWrappers::GLFrameBufferObj>
              ((vector<Diligent::FramebufferGLImpl::SubpassFramebuffers,std::allocator<Diligent::FramebufferGLImpl::SubpassFramebuffers>>
                *)&this->m_SubpassFramebuffers,&local_44,&local_f0);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&local_f0.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::~GLObjWrapper
              (&local_44.super_GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>);
  }
  return;
}

Assistant:

FramebufferGLImpl::FramebufferGLImpl(IReferenceCounters*    pRefCounters,
                                     RenderDeviceGLImpl*    pDevice,
                                     const FramebufferDesc& Desc,
                                     GLContextState&        CtxState) :
    TFramebufferBase{pRefCounters, pDevice, Desc}
{
    const auto& RPDesc = m_Desc.pRenderPass->GetDesc();
    m_SubpassFramebuffers.reserve(RPDesc.SubpassCount);
    for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
    {
        const auto& SubpassDesc = RPDesc.pSubpasses[subpass];

        TextureViewGLImpl* ppRTVs[MAX_RENDER_TARGETS] = {};
        TextureViewGLImpl* pDSV                       = nullptr;

        for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
        {
            const auto& RTAttachmentRef = SubpassDesc.pRenderTargetAttachments[rt];
            if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                ppRTVs[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RTAttachmentRef.AttachmentIndex]);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr && SubpassDesc.pDepthStencilAttachment->AttachmentIndex != ATTACHMENT_UNUSED)
        {
            pDSV = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex]);
        }
        auto RenderTargetFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV) ?
            GLObjectWrappers::GLFrameBufferObj{false} :
            FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRTVs, pDSV, Desc.Width, Desc.Height);

        GLObjectWrappers::GLFrameBufferObj ResolveFBO{false};
        if (SubpassDesc.pResolveAttachments != nullptr)
        {
            TextureViewGLImpl* ppRsvlViews[MAX_RENDER_TARGETS] = {};
            for (Uint32 rt = 0; rt < SubpassDesc.RenderTargetAttachmentCount; ++rt)
            {
                const auto& RslvAttachmentRef = SubpassDesc.pResolveAttachments[rt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    ppRsvlViews[rt] = ClassPtrCast<TextureViewGLImpl>(m_Desc.ppAttachments[RslvAttachmentRef.AttachmentIndex]);
                }
            }
            ResolveFBO = UseDefaultFBO(SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr) ?
                GLObjectWrappers::GLFrameBufferObj{false} :
                FBOCache::CreateFBO(CtxState, SubpassDesc.RenderTargetAttachmentCount, ppRsvlViews, nullptr, Desc.Width, Desc.Height);
        }

        RenderTargetFBO.SetName(m_Desc.Name);

        m_SubpassFramebuffers.emplace_back(std::move(RenderTargetFBO), std::move(ResolveFBO));
    }
}